

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::Bone::Bone(Bone *this)

{
  Bone *this_local;
  
  this->id = 0;
  std::__cxx11::string::string((string *)&this->name);
  this->parent = (Bone *)0x0;
  this->parentId = -1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->children);
  aiVector3t<float>::aiVector3t(&this->position);
  aiQuaterniont<float>::aiQuaterniont(&this->rotation);
  aiVector3t<float>::aiVector3t(&this->scale,1.0,1.0,1.0);
  aiMatrix4x4t<float>::aiMatrix4x4t(&this->worldMatrix);
  aiMatrix4x4t<float>::aiMatrix4x4t(&this->defaultPose);
  return;
}

Assistant:

Bone::Bone() :
    id(0),
    parent(0),
    parentId(-1),
    scale(1.0f, 1.0f, 1.0f)
{
}